

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddCircle
          (ImDrawList *this,ImVec2 *center,float radius,ImU32 col,int num_segments,float thickness)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  
  if (radius <= 0.0 || col < 0x1000000) {
    return;
  }
  if (num_segments < 1) {
    if ((int)radius < 0x40) {
      uVar1 = (uint)this->_Data->CircleSegmentCounts[(int)radius];
LAB_00144b15:
      uVar2 = uVar1;
      if (uVar1 != 0xc) goto LAB_00144b3b;
    }
    else {
      fVar3 = acosf((radius - this->_Data->CircleSegmentMaxError) / radius);
      uVar2 = (uint)(6.2831855 / fVar3);
      uVar1 = 0x200;
      if (uVar2 < 0x200) {
        uVar1 = uVar2;
      }
      if (0xb < (int)uVar2) goto LAB_00144b15;
    }
    PathArcToFast(this,center,radius + -0.5,0,0xb);
  }
  else {
    uVar1 = 0x200;
    if ((uint)num_segments < 0x200) {
      uVar1 = num_segments;
    }
    uVar2 = 3;
    if (2 < (uint)num_segments) goto LAB_00144b15;
LAB_00144b3b:
    PathArcTo(this,center,radius + -0.5,0.0,
              (((float)(int)uVar2 + -1.0) * 6.2831855) / (float)(int)uVar2,uVar2 - 1);
  }
  AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,true,thickness);
  (this->_Path).Size = 0;
  return;
}

Assistant:

void ImDrawList::AddCircle(const ImVec2& center, float radius, ImU32 col, int num_segments, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0 || radius <= 0.0f)
        return;

    // Obtain segment count
    if (num_segments <= 0)
    {
        // Automatic segment count
        const int radius_idx = (int)radius;
        if (radius_idx < IM_ARRAYSIZE(_Data->CircleSegmentCounts))
            num_segments = _Data->CircleSegmentCounts[radius_idx]; // Use cached value
        else
            num_segments = IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC(radius, _Data->CircleSegmentMaxError);
    }
    else
    {
        // Explicit segment count (still clamp to avoid drawing insanely tessellated shapes)
        num_segments = ImClamp(num_segments, 3, IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_MAX);
    }

    // Because we are filling a closed shape we remove 1 from the count of segments/points
    const float a_max = (IM_PI * 2.0f) * ((float)num_segments - 1.0f) / (float)num_segments;
    if (num_segments == 12)
        PathArcToFast(center, radius - 0.5f, 0, 12 - 1);
    else
        PathArcTo(center, radius - 0.5f, 0.0f, a_max, num_segments - 1);
    PathStroke(col, true, thickness);
}